

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_view_impl(ggml_context *ctx,ggml_tensor *a,int n_dims,int64_t *ne,size_t offset)

{
  ggml_tensor *tensor;
  
  tensor = ggml_new_tensor_impl(ctx,a->type,n_dims,ne,a,offset);
  ggml_format_name(tensor,"%s (view)",a->name);
  if (tensor != (ggml_tensor *)0x0) {
    *(size_t *)tensor->op_params = offset;
    tensor->op = GGML_OP_VIEW;
    tensor->src[0] = a;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h",
             0x70,"GGML_ASSERT(%s) failed","tensor != NULL");
}

Assistant:

static struct ggml_tensor * ggml_view_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_dims,
        const int64_t       * ne,
        size_t                offset) {
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, n_dims, ne, a, offset);
    ggml_format_name(result, "%s (view)", a->name);

    ggml_set_op_params(result, &offset, sizeof(offset));

    result->op     = GGML_OP_VIEW;
    result->src[0] = a;

    return result;
}